

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.h
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EmitterBeam::SetFundamentalParameterData
          (EmitterBeam *this,FundamentalParameterData *FPD)

{
  KFLOAT32 KVar1;
  KFLOAT32 KVar2;
  KFLOAT32 KVar3;
  KFLOAT32 KVar4;
  KFLOAT32 KVar5;
  KFLOAT32 KVar6;
  KFLOAT32 KVar7;
  
  KVar1 = FPD->m_f32BeamSweepSync;
  (this->m_FundamentalParameterData).m_f32BeamElevationSweep = FPD->m_f32BeamElevationSweep;
  (this->m_FundamentalParameterData).m_f32BeamSweepSync = KVar1;
  KVar4 = FPD->m_f32Freq;
  KVar5 = FPD->m_f32FreqRange;
  KVar6 = FPD->m_f32EffectiveRadiatedPower;
  KVar7 = FPD->m_f32PulseRepetitionFreq;
  KVar1 = FPD->m_f32BeamAzimuthCenter;
  KVar2 = FPD->m_f32BeamAzimuthSweep;
  KVar3 = FPD->m_f32BeamElevationCenter;
  (this->m_FundamentalParameterData).m_f32PulseWidth = FPD->m_f32PulseWidth;
  (this->m_FundamentalParameterData).m_f32BeamAzimuthCenter = KVar1;
  (this->m_FundamentalParameterData).m_f32BeamAzimuthSweep = KVar2;
  (this->m_FundamentalParameterData).m_f32BeamElevationCenter = KVar3;
  (this->m_FundamentalParameterData).m_f32Freq = KVar4;
  (this->m_FundamentalParameterData).m_f32FreqRange = KVar5;
  (this->m_FundamentalParameterData).m_f32EffectiveRadiatedPower = KVar6;
  (this->m_FundamentalParameterData).m_f32PulseRepetitionFreq = KVar7;
  return;
}

Assistant:

class KDIS_EXPORT FundamentalParameterData : public DataTypeBase
{
protected:

    KFLOAT32 m_f32Freq;

    KFLOAT32 m_f32FreqRange;

    KFLOAT32 m_f32EffectiveRadiatedPower;

    KFLOAT32 m_f32PulseRepetitionFreq;

    KFLOAT32 m_f32PulseWidth;

    KFLOAT32 m_f32BeamAzimuthCenter;

    KFLOAT32 m_f32BeamAzimuthSweep;

    KFLOAT32 m_f32BeamElevationCenter;

    KFLOAT32 m_f32BeamElevationSweep;

    KFLOAT32 m_f32BeamSweepSync;

public:

    static const KUINT16 FUNDAMENTAL_PARAMETER_SIZE = 40;

    FundamentalParameterData();

    explicit FundamentalParameterData(KDataStream &stream) noexcept(false);

    explicit FundamentalParameterData(KFLOAT32 Freq, KFLOAT32 FreqRange, KFLOAT32 EffectiveRadiatedPower,
                              KFLOAT32 PulseRepetitionFreq,  KFLOAT32 PulseWidth, KFLOAT32 BeamAzimuthCenter,
                              KFLOAT32 BeamAzimuthSweep, KFLOAT32 BeamElevationCenter, KFLOAT32 BeamElevationSweep,
                              KFLOAT32 BeamSweepSync );

    ~FundamentalParameterData() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetFrequency
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetFrequency
    // Description: Hertz
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetFrequency( KFLOAT32 F );
    KFLOAT32 GetFrequency() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetFrequencyRange
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetFrequencyRange
    // Description: Bandwidth range of frequencies, if a single frequency then set to 0.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetFrequencyRange( KFLOAT32 FR );
    KFLOAT32 GetFrequencyRange() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetEffectiveRadiatedPower
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetEffectiveRadiatedPower
    // Description: Average peak radiated power in dBm.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetEffectiveRadiatedPower( KFLOAT32 ERP );
    KFLOAT32 GetEffectiveRadiatedPower() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetPulseRepetitionFrequency
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetPulseRepetitionFrequency
    // Description: Hertz
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetPulseRepetitionFrequency( KFLOAT32 PRF );
    KFLOAT32 GetPulseRepetitionFrequency() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetPulseWidth
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetPulseWidth
    // Description: Average pulse width of the emission in microseconds.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetPulseWidth( KFLOAT32 PW );
    KFLOAT32 GetPulseWidth() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetBeamAzimuthCenter
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetBeamAzimuthCenter
    // Description: If coverage is a full 360 degrees then set to 0. In radians.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetBeamAzimuthCenter( KFLOAT32 BAC );
    KFLOAT32 GetBeamAzimuthCenter() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetBeamAzimuthSweep
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetBeamAzimuthSweep
    // Description: If coverage is a full 360 degrees then set to 0. In radians.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetBeamAzimuthSweep( KFLOAT32 BAS );
    KFLOAT32 GetBeamAzimuthSweep() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetBeamElevationCenter
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetBeamElevationCenter
    // Description: If coverage is a full 360 degrees then set to 0. In radians.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetBeamElevationCenter( KFLOAT32 BEC );
    KFLOAT32 GetBeamElevationCenter() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetBeamElevationSweep
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetBeamElevationSweep
    // Description: If coverage is a full 360 degrees then set to 0. In radians.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetBeamElevationSweep( KFLOAT32 BES );
    KFLOAT32 GetBeamElevationSweep() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::SetBeamSweepSync
    //              KDIS::DATA_TYPE::FundamentalParameterData::GetBeamSweepSync
    // Description: Used to allow a receiver to synchronize its regenerated scan pattern
    //              to that of the emitter. Specifies the percentage of time a scan is through
    //              its pattern from its origin.
    // Parameter:   KFLOAT32 F, void
    //************************************
    void SetBeamSweepSync( KFLOAT32 BSS );
    KFLOAT32 GetBeamSweepSync() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::FundamentalParameterData::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const FundamentalParameterData & Value ) const;
    KBOOL operator != ( const FundamentalParameterData & Value ) const;
}